

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainingTests.cpp
# Opt level: O0

void __thiscall
IsNotStringContainingCharacterTests::~IsNotStringContainingCharacterTests
          (IsNotStringContainingCharacterTests *this)

{
  IsNotStringContainingCharacterTests *this_local;
  
  ~IsNotStringContainingCharacterTests(this);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("string not containing desired string is true", [&]() {
			AssertThat(ut11::Is::String::Not::Containing('W')("AvsdaHelloasdagf"), ut11::Is::True);
		});

		Then("string containing desired string is false", [&]() {
			AssertThat(ut11::Is::String::Not::Containing('W')("World"), ut11::Is::False);
		});

		Then("Is::Not::String::Containing is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::String::Not::Containing('W')) >::value, ut11::Is::True);
		});

		Then("Is::Not::String::Containing has an error message", []() {
			AssertThat(ut11::Is::String::Not::Containing('P').GetErrorMessage("world"), ut11::Is::Not::EqualTo(""));
		});
	}